

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgList<float> * __thiscall
cimg_library::CImgList<float>::insert<float>
          (CImgList<float> *this,CImgList<float> *list,uint pos,bool shared)

{
  undefined1 in_CL;
  uint in_EDX;
  CImgList<float> *in_RSI;
  CImgList<float> *in_RDI;
  int l;
  uint npos;
  bool in_stack_000000db;
  uint in_stack_000000dc;
  CImg<float> *in_stack_000000e0;
  CImgList<float> *in_stack_000000e8;
  uint local_4c;
  CImgList<float> *in_stack_ffffffffffffffc8;
  CImgList<float> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 shared_00;
  int iVar1;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar2;
  
  shared_00 = (undefined1)((uint)in_stack_ffffffffffffffe0 >> 0x18);
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  local_4c = in_EDX;
  if (in_EDX == 0xffffffff) {
    local_4c = in_RDI->_width;
  }
  if (in_RDI == in_RSI) {
    CImgList(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    insert<float>(in_RSI,(CImgList<float> *)CONCAT44(in_EDX,uVar2),local_4c,(bool)shared_00);
    ~CImgList(in_stack_ffffffffffffffd0);
  }
  else {
    for (iVar1 = 0; iVar1 < (int)in_RSI->_width; iVar1 = iVar1 + 1) {
      cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
      insert(in_stack_000000e8,in_stack_000000e0,in_stack_000000dc,in_stack_000000db);
    }
  }
  return in_RDI;
}

Assistant:

CImgList<T>& insert(const CImgList<t>& list, const unsigned int pos=~0U, const bool shared=false) {
      const unsigned int npos = pos==~0U?_width:pos;
      if ((void*)this!=(void*)&list) cimglist_for(list,l) insert(list[l],npos+l,shared);
      else insert(CImgList<T>(list),npos,shared);
      return *this;
    }